

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O0

int __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  ulong uVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  int i_1;
  int i;
  float *weight_hc_IFOG;
  float *weight_xc_IFOG;
  float *weight_hc_G;
  float *weight_hc_O;
  float *weight_hc_F;
  float *weight_hc_I;
  float *weight_xc_G;
  float *weight_xc_O;
  float *weight_xc_F;
  float *weight_xc_I;
  int q;
  float *bias_c_IFOG;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  Mat weight_hc_data_packed_dr;
  Mat bias_c_data_packed_dr;
  Mat weight_xc_data_packed_dr;
  Mat weight_hc;
  Mat bias_c;
  Mat weight_xc;
  int dr;
  int size;
  int num_directions;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffff690;
  int _elempack;
  size_t in_stack_fffffffffffff698;
  undefined8 in_stack_fffffffffffff6a0;
  int _c;
  undefined8 in_stack_fffffffffffff6a8;
  Mat *in_stack_fffffffffffff6b0;
  Allocator *in_stack_fffffffffffff710;
  int local_820;
  int local_81c;
  undefined4 *local_818;
  undefined4 *local_810;
  int local_7c4;
  undefined4 *local_7c0;
  undefined8 local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined4 local_780;
  long local_778;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined4 local_738;
  long local_730;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined4 local_6a8;
  undefined8 local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined8 local_680;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined4 local_650;
  undefined8 local_648;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined4 local_608;
  undefined8 local_600;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined8 local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  byte *local_5c8;
  undefined8 *local_5b8;
  undefined8 *local_5a8;
  undefined8 *local_598;
  undefined8 *local_588;
  undefined8 *local_578;
  undefined8 *local_568;
  undefined1 local_555;
  int local_554;
  long *local_550;
  undefined8 *local_548;
  undefined1 local_535;
  int local_534;
  long *local_530;
  undefined8 *local_528;
  undefined1 local_515;
  int local_514;
  long *local_510;
  undefined8 *local_508;
  undefined1 local_4f5;
  int local_4f4;
  long *local_4f0;
  undefined8 *local_4e8;
  undefined1 local_4d5;
  int local_4d4;
  long *local_4d0;
  undefined8 *local_4c8;
  undefined1 local_4b5;
  int local_4b4;
  long *local_4b0;
  undefined8 *local_4a8;
  int local_494;
  undefined8 *local_490;
  int local_484;
  undefined8 *local_480;
  int local_474;
  undefined8 *local_470;
  int local_464;
  undefined8 *local_460;
  int local_454;
  undefined8 *local_450;
  int local_444;
  undefined8 *local_440;
  int local_434;
  undefined8 *local_430;
  int local_424;
  undefined8 *local_420;
  undefined4 local_414;
  undefined8 *local_410;
  undefined4 local_404;
  undefined8 *local_400;
  undefined4 local_3f4;
  undefined8 *local_3f0;
  undefined4 local_3e4;
  undefined8 *local_3e0;
  int local_3d4;
  undefined8 *local_3d0;
  int local_3c4;
  undefined8 *local_3c0;
  undefined4 local_3b4;
  undefined8 *local_3b0;
  undefined8 *local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  undefined8 *local_290;
  int local_288;
  undefined4 local_284;
  undefined8 *local_280;
  int local_278;
  undefined4 local_274;
  undefined8 *local_270;
  int local_268;
  undefined4 local_264;
  undefined8 *local_260;
  undefined8 local_258;
  undefined4 local_24c;
  long local_248;
  long local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  undefined8 local_220;
  undefined4 local_214;
  long local_210;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  long local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long local_140;
  undefined4 local_134;
  long local_130;
  long local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  
  _c = (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
  local_5cc = 1;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 2) {
    local_5cc = 2;
  }
  uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / (long)local_5cc;
  uVar4 = (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
  local_5d0 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 4);
  _elempack = (int)((ulong)in_stack_fffffffffffff690 >> 0x20);
  local_5c8 = in_RSI;
  Mat::create(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
              (int)in_stack_fffffffffffff6a8,_c,in_stack_fffffffffffff698,_elempack,
              in_stack_fffffffffffff710);
  Mat::create(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
              (int)in_stack_fffffffffffff6a8,_c,in_stack_fffffffffffff698,_elempack,
              in_stack_fffffffffffff710);
  Mat::create(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
              (int)in_stack_fffffffffffff6a8,_c,in_stack_fffffffffffff698,_elempack,
              in_stack_fffffffffffff710);
  for (local_5d4 = 0; local_5d4 < local_5cc; local_5d4 = local_5d4 + 1) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    local_4b0 = (long *)((long)in_RDI + lVar1 + 0x128);
    local_4a8 = &local_620;
    local_22c = *(int *)((long)in_RDI + lVar1 + 0x154);
    local_230 = *(int *)((long)in_RDI + lVar1 + 0x158);
    local_234 = *(undefined4 *)((long)in_RDI + lVar1 + 0x15c);
    local_240 = *local_4b0 +
                *(long *)((long)in_RDI + lVar1 + 0x168) * (long)local_5d4 *
                *(long *)((long)in_RDI + lVar1 + 0x138);
    local_248 = *(long *)((long)in_RDI + lVar1 + 0x138);
    local_24c = *(undefined4 *)((long)in_RDI + lVar1 + 0x140);
    local_258 = *(undefined8 *)((long)in_RDI + lVar1 + 0x148);
    local_228 = &local_620;
    local_b0 = (long)local_22c * (long)local_230 * local_248;
    lVar1 = *(long *)(*in_RDI + -0x18);
    local_4d0 = (long *)((long)in_RDI + lVar1 + 0x170);
    local_4c8 = &local_668;
    local_1f4 = *(int *)((long)in_RDI + lVar1 + 0x19c);
    local_1f8 = *(int *)((long)in_RDI + lVar1 + 0x1a0);
    local_1fc = *(undefined4 *)((long)in_RDI + lVar1 + 0x1a4);
    local_208 = *local_4d0 +
                *(long *)((long)in_RDI + lVar1 + 0x1b0) * (long)local_5d4 *
                *(long *)((long)in_RDI + lVar1 + 0x180);
    local_210 = *(long *)((long)in_RDI + lVar1 + 0x180);
    local_214 = *(undefined4 *)((long)in_RDI + lVar1 + 0x188);
    local_220 = *(undefined8 *)((long)in_RDI + lVar1 + 400);
    local_1f0 = &local_668;
    local_c0 = (long)local_1f4 * (long)local_1f8 * local_210;
    lVar1 = *(long *)(*in_RDI + -0x18);
    local_4f0 = (long *)((long)in_RDI + lVar1 + 0xe0);
    local_4e8 = &local_6c0;
    local_1bc = *(int *)((long)in_RDI + lVar1 + 0x10c);
    local_1c0 = *(int *)((long)in_RDI + lVar1 + 0x110);
    local_1c4 = *(undefined4 *)((long)in_RDI + lVar1 + 0x114);
    local_1d0 = *local_4f0 +
                *(long *)((long)in_RDI + lVar1 + 0x120) * (long)local_5d4 *
                *(long *)((long)in_RDI + lVar1 + 0xf0);
    local_1d8 = *(long *)((long)in_RDI + lVar1 + 0xf0);
    local_1dc = *(undefined4 *)((long)in_RDI + lVar1 + 0xf8);
    local_1e8 = *(undefined8 *)((long)in_RDI + lVar1 + 0x100);
    local_1b8 = &local_6c0;
    local_d0 = (long)local_1bc * (long)local_1c0 * local_1d8;
    local_510 = in_RDI + 1;
    local_508 = &local_708;
    local_184 = *(int *)((long)in_RDI + 0x34);
    local_188 = (int)in_RDI[7];
    local_18c = *(undefined4 *)((long)in_RDI + 0x3c);
    local_198 = *local_510 + in_RDI[9] * (long)local_5d4 * in_RDI[3];
    local_1a0 = in_RDI[3];
    local_1a4 = (undefined4)in_RDI[4];
    local_1b0 = in_RDI[5];
    local_180 = &local_708;
    local_e0 = (long)local_184 * (long)local_188 * local_1a0;
    local_530 = in_RDI + 10;
    local_528 = &local_750;
    local_14c = *(int *)((long)in_RDI + 0x7c);
    local_150 = (int)in_RDI[0x10];
    local_154 = *(undefined4 *)((long)in_RDI + 0x84);
    local_160 = (undefined4 *)(*local_530 + in_RDI[0x12] * (long)local_5d4 * in_RDI[0xc]);
    local_168 = in_RDI[0xc];
    local_16c = (undefined4)in_RDI[0xd];
    local_178 = in_RDI[0xe];
    local_148 = &local_750;
    local_f0 = (long)local_14c * (long)local_150 * local_168;
    local_550 = in_RDI + 0x13;
    local_548 = &local_798;
    local_114 = *(int *)((long)in_RDI + 0xc4);
    local_118 = (int)in_RDI[0x19];
    local_11c = *(undefined4 *)((long)in_RDI + 0xcc);
    local_128 = *local_550 + in_RDI[0x1b] * (long)local_5d4 * in_RDI[0x15];
    local_130 = in_RDI[0x15];
    local_134 = (undefined4)in_RDI[0x16];
    local_140 = in_RDI[0x17];
    local_110 = &local_798;
    local_100 = (long)local_114 * (long)local_118 * local_130;
    local_3e0 = &local_668;
    local_3f0 = &local_668;
    local_400 = &local_668;
    local_410 = &local_668;
    local_3b0 = &local_750;
    local_7c0 = local_160;
    for (local_7c4 = 0; local_7c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
        local_7c4 = local_7c4 + 1) {
      *local_7c0 = *(undefined4 *)(local_208 + (long)local_7c4 * 4);
      local_7c0[1] = *(undefined4 *)(local_208 + local_1f4 * local_210 + (long)local_7c4 * 4);
      local_7c0[2] = *(undefined4 *)
                      (local_208 + (long)local_1f4 * 2 * local_210 + (long)local_7c4 * 4);
      local_7c0[3] = *(undefined4 *)
                      (local_208 + (long)local_1f4 * 3 * local_210 + (long)local_7c4 * 4);
      local_7c0 = local_7c0 + 4;
      local_420 = &local_620;
      local_424 = local_7c4;
      local_434 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_7c4;
      local_430 = &local_620;
      local_444 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_7c4;
      local_440 = &local_620;
      local_454 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_7c4;
      local_450 = &local_620;
      local_460 = &local_6c0;
      local_464 = local_7c4;
      local_474 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_7c4;
      local_470 = &local_6c0;
      local_484 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 2 + local_7c4;
      local_480 = &local_6c0;
      local_494 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * 3 + local_7c4;
      local_490 = &local_6c0;
      local_3c0 = &local_708;
      local_3c4 = local_7c4;
      local_810 = (undefined4 *)(local_198 + (long)local_184 * (long)local_7c4 * local_1a0);
      local_3d0 = &local_798;
      local_3d4 = local_7c4;
      local_818 = (undefined4 *)(local_128 + (long)local_114 * (long)local_7c4 * local_130);
      for (local_81c = 0; local_81c < local_5d0; local_81c = local_81c + 1) {
        *local_810 = *(undefined4 *)
                      (local_240 + (long)local_22c * (long)local_7c4 * local_248 +
                      (long)local_81c * 4);
        local_810[1] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_434 * local_248 +
                        (long)local_81c * 4);
        local_810[2] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_444 * local_248 +
                        (long)local_81c * 4);
        local_810[3] = *(undefined4 *)
                        (local_240 + (long)local_22c * (long)local_454 * local_248 +
                        (long)local_81c * 4);
        local_810 = local_810 + 4;
      }
      for (local_820 = 0; local_820 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_820 = local_820 + 1) {
        *local_818 = *(undefined4 *)
                      (local_1d0 + (long)local_1bc * (long)local_7c4 * local_1d8 +
                      (long)local_820 * 4);
        local_818[1] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_474 * local_1d8 +
                        (long)local_820 * 4);
        local_818[2] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_484 * local_1d8 +
                        (long)local_820 * 4);
        local_818[3] = *(undefined4 *)
                        (local_1d0 + (long)local_1bc * (long)local_494 * local_1d8 +
                        (long)local_820 * 4);
        local_818 = local_818 + 4;
      }
    }
    local_5b8 = &local_798;
    local_5a8 = &local_750;
    local_598 = &local_708;
    local_588 = &local_6c0;
    local_578 = &local_668;
    local_688 = 0;
    local_68c = 0;
    local_690 = 0;
    local_694 = 0;
    local_6a8 = 0;
    local_6b0 = 0;
    local_6b8 = 0;
    local_6c0 = 0;
    local_6d0 = 0;
    local_6d4 = 0;
    local_6d8 = 0;
    local_6dc = 0;
    local_6f0 = 0;
    local_6f8 = 0;
    local_700 = 0;
    local_708 = 0;
    local_718 = 0;
    local_71c = 0;
    local_720 = 0;
    local_724 = 0;
    local_738 = 0;
    local_740 = 0;
    local_748 = 0;
    local_750 = 0;
    local_760 = 0;
    local_764 = 0;
    local_768 = 0;
    local_76c = 0;
    local_780 = 0;
    local_788 = 0;
    local_790 = 0;
    local_798 = 0;
    local_680 = 0;
    local_698 = 0;
    local_6c8 = 0;
    local_6e0 = 0;
    local_710 = 0;
    local_728 = 0;
    local_758 = 0;
    local_770 = 0;
    local_668 = 0;
    local_658 = 0;
    local_650 = 0;
    local_640 = 0;
    local_63c = 0;
    local_638 = 0;
    local_634 = 0;
    local_630 = 0;
    local_628 = 0;
    local_660 = 0;
    local_568 = &local_620;
    local_b4 = 0x10;
    local_c4 = 0x10;
    local_d4 = 0x10;
    local_e4 = 0x10;
    local_f4 = 0x10;
    local_104 = 0x10;
    local_3b4 = 0;
    local_3e4 = 0;
    local_3f4 = 1;
    local_404 = 2;
    local_414 = 3;
    local_4b4 = local_5d4;
    local_4b5 = 1;
    local_4d4 = local_5d4;
    local_4d5 = 1;
    local_4f4 = local_5d4;
    local_4f5 = 1;
    local_514 = local_5d4;
    local_515 = 1;
    local_534 = local_5d4;
    local_535 = 1;
    local_554 = local_5d4;
    local_555 = 1;
    local_620 = 0;
    local_610 = 0;
    local_608 = 0;
    local_5f8 = 0;
    local_5f4 = 0;
    local_5f0 = 0;
    local_5ec = 0;
    local_5e8 = 0;
    local_5e0 = 0;
    local_618 = 0;
    local_330 = local_568;
    local_310 = local_578;
    local_2f0 = local_588;
    local_2d0 = local_598;
    local_2b0 = local_5a8;
    local_290 = local_5b8;
    local_778 = local_140;
    local_730 = local_178;
    local_6e8 = local_1b0;
    local_6a0 = local_1e8;
    local_648 = local_220;
    local_600 = local_258;
  }
  if ((*local_5c8 & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar1 + 0x128);
    local_260 = puVar5;
    if (*(long *)((long)in_RDI + lVar1 + 0x130) != 0) {
      piVar2 = *(int **)((long)in_RDI + lVar1 + 0x130);
      local_264 = 0xffffffff;
      LOCK();
      local_268 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_268 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 0x148) == 0) {
          local_a8 = (void *)*puVar5;
          if (local_a8 != (void *)0x0) {
            free(local_a8);
          }
        }
        else {
          plVar3 = *(long **)((long)in_RDI + lVar1 + 0x148);
          (**(code **)(*plVar3 + 0x18))(plVar3,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    puVar5[2] = 0;
    *(undefined4 *)(puVar5 + 3) = 0;
    *(undefined4 *)(puVar5 + 5) = 0;
    *(undefined4 *)((long)puVar5 + 0x2c) = 0;
    *(undefined4 *)(puVar5 + 6) = 0;
    *(undefined4 *)((long)puVar5 + 0x34) = 0;
    *(undefined4 *)(puVar5 + 7) = 0;
    puVar5[8] = 0;
    puVar5[1] = 0;
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar1 + 0x170);
    local_270 = puVar5;
    if (*(long *)((long)in_RDI + lVar1 + 0x178) != 0) {
      piVar2 = *(int **)((long)in_RDI + lVar1 + 0x178);
      local_274 = 0xffffffff;
      LOCK();
      local_278 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_278 == 1) {
        if (*(long *)((long)in_RDI + lVar1 + 400) == 0) {
          local_a0 = (void *)*puVar5;
          if (local_a0 != (void *)0x0) {
            free(local_a0);
          }
        }
        else {
          plVar3 = *(long **)((long)in_RDI + lVar1 + 400);
          (**(code **)(*plVar3 + 0x18))(plVar3,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x180) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x188) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x19c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1a4) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x1a8) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x1b0) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x178) = 0;
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar1 + 0xe0);
    if (*(long *)((long)in_RDI + lVar1 + 0xe8) != 0) {
      piVar2 = *(int **)((long)in_RDI + lVar1 + 0xe8);
      local_284 = 0xffffffff;
      LOCK();
      local_288 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (local_288 == 1) {
        local_280 = puVar5;
        if (*(long *)((long)in_RDI + lVar1 + 0x100) == 0) {
          local_98 = (void *)*puVar5;
          if (local_98 != (void *)0x0) {
            free(local_98);
          }
        }
        else {
          plVar3 = *(long **)((long)in_RDI + lVar1 + 0x100);
          (**(code **)(*plVar3 + 0x18))(plVar3,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0xf0) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0xf8) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x108) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x10c) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x110) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x114) = 0;
    *(undefined4 *)((long)in_RDI + lVar1 + 0x118) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0x120) = 0;
    *(undefined8 *)((long)in_RDI + lVar1 + 0xe8) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}